

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O2

int bip32_key_from_parent_path
              (ext_key *hdkey,uint32_t *child_path,size_t child_path_len,uint32_t flags,
              ext_key *key_out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ext_key *key_out_00;
  ulong uVar5;
  uint flags_00;
  size_t sVar6;
  ext_key tmp [2];
  
  iVar4 = -2;
  if ((flags < 0x20) &&
     (key_out != (ext_key *)0x0 &&
      (child_path_len - 1 < 0xff && (child_path != (uint32_t *)0x0 && hdkey != (ext_key *)0x0)))) {
    flags_00 = flags | 2;
    uVar5 = 0;
    for (sVar6 = 0; child_path_len != sVar6; sVar6 = sVar6 + 1) {
      key_out_00 = tmp + uVar5;
      if ((flags & 4) != 0) {
        uVar1 = *(undefined8 *)hdkey->pub_key_tweak_sum;
        uVar2 = *(undefined8 *)(hdkey->pub_key_tweak_sum + 8);
        uVar3 = *(undefined8 *)(hdkey->pub_key_tweak_sum + 0x18);
        *(undefined8 *)(tmp[uVar5].pub_key_tweak_sum + 0x10) =
             *(undefined8 *)(hdkey->pub_key_tweak_sum + 0x10);
        *(undefined8 *)(tmp[uVar5].pub_key_tweak_sum + 0x18) = uVar3;
        *(undefined8 *)tmp[uVar5].pub_key_tweak_sum = uVar1;
        *(undefined8 *)(tmp[uVar5].pub_key_tweak_sum + 8) = uVar2;
      }
      if (child_path_len <= sVar6 + 2) {
        flags_00 = flags;
      }
      iVar4 = bip32_key_from_parent(hdkey,child_path[sVar6],flags_00,key_out_00);
      if (iVar4 != 0) goto LAB_00444245;
      uVar5 = uVar5 ^ 1;
      hdkey = key_out_00;
    }
    memcpy(key_out,hdkey,0xc0);
    iVar4 = 0;
LAB_00444245:
    wally_clear(tmp,0x180);
  }
  return iVar4;
}

Assistant:

int bip32_key_from_parent_path(const struct ext_key *hdkey,
                               const uint32_t *child_path, size_t child_path_len,
                               uint32_t flags, struct ext_key *key_out)
{
    /* Optimization: We can skip hash calculations for internal nodes */
    uint32_t derivation_flags = flags | BIP32_FLAG_SKIP_HASH;
    struct ext_key tmp[2];
    size_t i, tmp_idx = 0;
    int ret;

    if (flags & ~BIP32_ALL_DEFINED_FLAGS)
        return WALLY_EINVAL; /* These flags are not defined yet */

    if (!hdkey || !child_path || !child_path_len || child_path_len > BIP32_PATH_MAX_LEN || !key_out)
        return WALLY_EINVAL;

    for (i = 0; i < child_path_len; ++i) {
        struct ext_key *derived = &tmp[tmp_idx];
#ifdef BUILD_ELEMENTS
        if (flags & BIP32_FLAG_KEY_TWEAK_SUM)
            memcpy(derived->pub_key_tweak_sum, hdkey->pub_key_tweak_sum, sizeof(hdkey->pub_key_tweak_sum));
#endif /* BUILD_ELEMENTS */
        if (i + 2 >= child_path_len)
            derivation_flags = flags; /* Use callers flags for the final derivations */
        ret = bip32_key_from_parent(hdkey, child_path[i], derivation_flags, derived);
        if (ret != WALLY_OK)
            break;

        hdkey = derived;    /* Derived becomes next parent */
        tmp_idx = !tmp_idx; /* Use free slot in tmp for next derived */
    }

    if (ret == WALLY_OK)
        memcpy(key_out, hdkey, sizeof(*key_out));

    wally_clear(tmp, sizeof(tmp));
    return ret;
}